

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lysp_type_enum_dup(ly_ctx *ctx,lysp_module *pmod,lysp_type_enum *orig_enm,lysp_type_enum *enm
                         )

{
  LY_ERR LVar1;
  lysp_ext_instance *local_f8;
  lysp_ext_instance *local_e8;
  lysp_ext_instance *local_d8;
  lysp_ext_instance *local_d0;
  lysp_ext_instance *local_b8;
  char *local_b0;
  long local_a0;
  long local_90;
  long local_88;
  long *plStack_68;
  LY_ERR ret___1;
  char *p___1;
  uint64_t __new_start;
  uint64_t __u_1;
  long *plStack_48;
  LY_ERR ret__;
  char *p__;
  uint64_t __u;
  LY_ERR ret;
  lysp_type_enum *enm_local;
  lysp_type_enum *orig_enm_local;
  lysp_module *pmod_local;
  ly_ctx *ctx_local;
  
  lydict_dup(ctx,orig_enm->name,&enm->name);
  lydict_dup(ctx,orig_enm->dsc,&enm->dsc);
  LVar1 = lydict_dup(ctx,orig_enm->ref,&enm->ref);
  enm->value = orig_enm->value;
  if (orig_enm->iffeatures == (lysp_qname *)0x0) {
LAB_0018417f:
    if (orig_enm->exts == (lysp_ext_instance *)0x0) {
LAB_00184449:
      enm->flags = orig_enm->flags;
      ctx_local._4_4_ = LVar1;
    }
    else {
      if (enm->exts == (lysp_ext_instance *)0x0) {
        local_b8 = (lysp_ext_instance *)0x0;
      }
      else {
        local_b8 = enm->exts[-1].exts;
      }
      if (enm->exts == (lysp_ext_instance *)0x0) {
        if (orig_enm->exts == (lysp_ext_instance *)0x0) {
          local_d8 = (lysp_ext_instance *)0x0;
        }
        else {
          local_d8 = orig_enm->exts[-1].exts;
        }
        plStack_68 = (long *)calloc(1,(long)local_d8 * 0x70 + 8);
        if (plStack_68 == (long *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_enum_dup");
          return LY_EMEM;
        }
      }
      else {
        if (orig_enm->exts == (lysp_ext_instance *)0x0) {
          local_d0 = (lysp_ext_instance *)0x0;
        }
        else {
          local_d0 = orig_enm->exts[-1].exts;
        }
        plStack_68 = (long *)realloc(&enm->exts[-1].exts,
                                     ((long)&local_d0->name + (long)&(enm->exts[-1].exts)->name) *
                                     0x70 + 8);
        if (plStack_68 == (long *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_enum_dup");
          return LY_EMEM;
        }
      }
      enm->exts = (lysp_ext_instance *)(plStack_68 + 1);
      if (enm->exts != (lysp_ext_instance *)0x0) {
        if (orig_enm->exts == (lysp_ext_instance *)0x0) {
          local_e8 = (lysp_ext_instance *)0x0;
        }
        else {
          local_e8 = orig_enm->exts[-1].exts;
        }
        memset(enm->exts + *plStack_68,0,(long)local_e8 * 0x70);
      }
      __new_start = 0;
      while( true ) {
        if (orig_enm->exts == (lysp_ext_instance *)0x0) {
          local_f8 = (lysp_ext_instance *)0x0;
        }
        else {
          local_f8 = orig_enm->exts[-1].exts;
        }
        if (local_f8 <= __new_start) goto LAB_00184449;
        enm->exts[-1].exts = (lysp_ext_instance *)((long)&(enm->exts[-1].exts)->name + 1);
        ctx_local._4_4_ =
             lysp_ext_dup(ctx,pmod,enm,LY_STMT_ENUM,orig_enm->exts + __new_start,
                          enm->exts + (long)&local_b8->name + __new_start);
        if (ctx_local._4_4_ != LY_SUCCESS) break;
        __new_start = __new_start + 1;
      }
    }
  }
  else {
    if (enm->iffeatures == (lysp_qname *)0x0) {
      if (orig_enm->iffeatures == (lysp_qname *)0x0) {
        local_90 = 0;
      }
      else {
        local_90 = *(long *)&orig_enm->iffeatures[-1].flags;
      }
      plStack_48 = (long *)calloc(1,local_90 * 0x18 + 8);
      if (plStack_48 == (long *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_enum_dup");
        return LY_EMEM;
      }
    }
    else {
      if (orig_enm->iffeatures == (lysp_qname *)0x0) {
        local_88 = 0;
      }
      else {
        local_88 = *(long *)&orig_enm->iffeatures[-1].flags;
      }
      plStack_48 = (long *)realloc(&enm->iffeatures[-1].flags,
                                   (*(long *)&enm->iffeatures[-1].flags + local_88) * 0x18 + 8);
      if (plStack_48 == (long *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_enum_dup");
        return LY_EMEM;
      }
    }
    enm->iffeatures = (lysp_qname *)(plStack_48 + 1);
    if (enm->iffeatures != (lysp_qname *)0x0) {
      if (orig_enm->iffeatures == (lysp_qname *)0x0) {
        local_a0 = 0;
      }
      else {
        local_a0 = *(long *)&orig_enm->iffeatures[-1].flags;
      }
      memset(enm->iffeatures + *plStack_48,0,local_a0 * 0x18);
    }
    p__ = (char *)0x0;
    while( true ) {
      if (orig_enm->iffeatures == (lysp_qname *)0x0) {
        local_b0 = (char *)0x0;
      }
      else {
        local_b0 = *(char **)&orig_enm->iffeatures[-1].flags;
      }
      if (local_b0 <= p__) goto LAB_0018417f;
      *(long *)&enm->iffeatures[-1].flags = *(long *)&enm->iffeatures[-1].flags + 1;
      ctx_local._4_4_ =
           lysp_qname_dup(ctx,orig_enm->iffeatures + (long)p__,enm->iffeatures + (long)p__);
      if (ctx_local._4_4_ != LY_SUCCESS) break;
      p__ = p__ + 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_type_enum_dup(const struct ly_ctx *ctx, const struct lysp_module *pmod, const struct lysp_type_enum *orig_enm,
        struct lysp_type_enum *enm)
{
    LY_ERR ret = LY_SUCCESS;

    DUP_STRING(ctx, orig_enm->name, enm->name, ret);
    DUP_STRING(ctx, orig_enm->dsc, enm->dsc, ret);
    DUP_STRING(ctx, orig_enm->ref, enm->ref, ret);
    enm->value = orig_enm->value;
    DUP_ARRAY(ctx, orig_enm->iffeatures, enm->iffeatures, lysp_qname_dup);
    DUP_EXTS(ctx, pmod, enm, LY_STMT_ENUM, orig_enm->exts, enm->exts, lysp_ext_dup);
    enm->flags = orig_enm->flags;

    return ret;
}